

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsocket.c
# Opt level: O3

int mg_socket_options(int sock,mg_session *session)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  long lVar4;
  int optval;
  undefined4 local_2c;
  
  lVar4 = 0;
  do {
    local_2c = *(undefined4 *)((long)&DAT_0010cb88 + lVar4);
    iVar1 = setsockopt(sock,*(int *)((long)&DAT_0010cb80 + lVar4),
                       *(int *)((long)&DAT_0010cb84 + lVar4),&local_2c,4);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      mg_session_set_error(session,"couldn\'t set socket option: %s",pcVar3);
      iVar1 = mg_socket_close(sock);
      if (iVar1 == 0) {
        return -8;
      }
      abort();
    }
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x3c);
  return 0;
}

Assistant:

int mg_socket_options(int sock, mg_session *session) {
#ifdef __EMSCRIPTEN__
  (void)sock;
  (void)session;
  return MG_SUCCESS;
#else
  struct {
    int level;
    int optname;
    int optval;
  } socket_options[] = {// disable Nagle algorithm for performance reasons
                        {SOL_TCP, TCP_NODELAY, 1},
                        // turn keep-alive on
                        {SOL_SOCKET, SO_KEEPALIVE, 1},
                        // wait 20s before sending keep-alive packets
                        {SOL_TCP, TCP_KEEPIDLE, 20},
                        // 4 keep-alive packets must fail to close
                        {SOL_TCP, TCP_KEEPCNT, 4},
                        // send keep-alive packets every 15s
                        {SOL_TCP, TCP_KEEPINTVL, 15}};
  const size_t OPTCNT = sizeof(socket_options) / sizeof(socket_options[0]);

  for (size_t i = 0; i < OPTCNT; ++i) {
    int optval = socket_options[i].optval;
    socklen_t optlen = sizeof(optval);

    if (setsockopt(sock, socket_options[i].level, socket_options[i].optname,
                   (void *)&optval, optlen) != 0) {
      mg_session_set_error(session, "couldn't set socket option: %s",
                           mg_socket_error());
      if (mg_socket_close(sock) != 0) {
        abort();
      }
      return MG_ERROR_NETWORK_FAILURE;
    }
  }
  return MG_SUCCESS;
#endif
}